

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_to_n32_unsafe.cc
# Opt level: O2

bool s_to_u32_unsafe(char *s,char *s_end,uint32_t *number)

{
  ulong uVar1;
  char *pcVar2;
  
  uVar1 = 0;
  do {
    pcVar2 = s;
    if (pcVar2 == s_end) {
      *number = (uint32_t)uVar1;
      break;
    }
    uVar1 = (ulong)((int)*pcVar2 - 0x30) + uVar1 * 10;
    s = pcVar2 + 1;
  } while (uVar1 < 0xffffffff);
  return pcVar2 == s_end;
}

Assistant:

bool s_to_u32_unsafe (const char * s, const char * s_end, uint32_t & number)
{
	uint64_t u = 0;
	for (; s != s_end; ++s)
	{
		u *= 10;
		u += static_cast<uint32_t> (*s) - 0x30;
		if (u >= std::numeric_limits<uint32_t>::max())
		{
			return false;
		}
	}
	number = static_cast<uint32_t> (u);
	return true;
}